

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

FrameBuffer * __thiscall Imf_3_4::ScanLineInputFile::frameBuffer(ScanLineInputFile *this)

{
  element_type *peVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::
  __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x226cbc);
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x226cde);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x226cf1);
  return &peVar1->frameBuffer;
}

Assistant:

const FrameBuffer&
ScanLineInputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    return _data->frameBuffer;
}